

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>
::~btree(btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>
         *this)

{
  if (this->size_ != 0) {
    btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>
    ::clear_and_delete(this->root_,(allocator_type *)&this->rightmost_);
  }
  (this->rightmost_).
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::StringBtreeDefaultLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>_*,_2UL,_false>
  .value = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_256,_false>_>
            *)btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>>,256,false>>
              ::EmptyNode()::empty_node_abi_cxx11_;
  this->root_ = (node_type *)
                btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>>,256,false>>
                ::EmptyNode()::empty_node_abi_cxx11_;
  this->size_ = 0;
  return;
}

Assistant:

~btree() {
    // Put static_asserts in destructor to avoid triggering them before the type
    // is complete.
    static_assert(static_assert_validation(), "This call must be elided.");
    clear();
  }